

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O1

PrettyPrinterNode * getFirstBadLine(PrettyPrinterNode *start,int line_length)

{
  int *piVar1;
  int iVar2;
  PrettyPrinterNode *pPVar3;
  
  if (start->is_line_separator == true) {
    __assert_fail("!start->is_line_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                  ,0x13c,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
  }
  pPVar3 = start;
  iVar2 = start->line;
  while( true ) {
    while (pPVar3->is_line_separator == true) {
      pPVar3 = pPVar3->next;
      if (pPVar3 == (PrettyPrinterNode *)0x0) {
        __assert_fail("start->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                      ,0x141,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
      }
    }
    piVar1 = &pPVar3->line;
    if (*piVar1 != iVar2) {
      start = pPVar3;
    }
    if (line_length < pPVar3->offset) break;
    pPVar3 = pPVar3->next;
    iVar2 = *piVar1;
    if (pPVar3 == (PrettyPrinterNode *)0x0) {
      return (PrettyPrinterNode *)0x0;
    }
  }
  return start;
}

Assistant:

static PrettyPrinterNode* getFirstBadLine(PrettyPrinterNode* start, int line_length) {
  assert(!start->is_line_separator);
  int currentLine = start->line;
  auto* currentLineNode = start;
  for(;;) {
    if(start->is_line_separator) {
      assert(start->next);
      start = start->next;
    } else {
      if(start->line != currentLine) {
        currentLine = start->line;
        currentLineNode = start;
      }
      if(start->offset > line_length) {
        return currentLineNode;
      }
      if(!start->next) {
        return nullptr;
      }
      start = start->next;
    }
  }
}